

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureBarrierTests.cpp
# Opt level: O3

char * __thiscall gl4cts::TextureBarrierSameTexelRWBase::fsh(TextureBarrierSameTexelRWBase *this)

{
  return 
  "#version 400 core\n#define NUM_TEXTURES 8\nuniform usampler2D texInput[NUM_TEXTURES];\nout uvec4 fragOutput[NUM_TEXTURES];\nuvec4 func(uvec4 t) {\n    return t + 1;\n}\nvoid main() {\n    ivec2 texelCoord = ivec2(gl_FragCoord.xy);\n    for (int i = 0; i < NUM_TEXTURES; ++i) {\n        fragOutput[i] = func(texelFetch(texInput[i], texelCoord, 0));\n    }\n}"
  ;
}

Assistant:

virtual const char* fsh()
	{
		return "#version 400 core\n"
			   "#define NUM_TEXTURES 8\n"
			   "uniform usampler2D texInput[NUM_TEXTURES];\n"
			   "out uvec4 fragOutput[NUM_TEXTURES];\n"
			   "uvec4 func(uvec4 t) {\n"
			   "    return t + 1;\n"
			   "}\n"
			   "void main() {\n"
			   "    ivec2 texelCoord = ivec2(gl_FragCoord.xy);\n"
			   "    for (int i = 0; i < NUM_TEXTURES; ++i) {\n"
			   "        fragOutput[i] = func(texelFetch(texInput[i], texelCoord, 0));\n"
			   "    }\n"
			   "}";
	}